

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::allot(Forth *this)

{
  uint value;
  Forth *this_local;
  
  requireDStackDepth(this,1,"ALLOT");
  checkValidHere(this,"ALLOT");
  requireDataSpaceAvailable(this,(ulong)this->CellSize,"ALLOT");
  value = ForthStack<unsigned_int>::getTop(&this->dStack);
  incDataPointer(this,value);
  pop(this);
  return;
}

Assistant:

void allot() {
			REQUIRE_DSTACK_DEPTH(1, "ALLOT");
			REQUIRE_VALID_HERE("ALLOT");
			REQUIRE_DATASPACE_AVAILABLE(CellSize, "ALLOT");
			incDataPointer( static_cast<SCell>( dStack.getTop() ) ); pop();
		}